

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  pointer pbVar1;
  bool bVar2;
  char cVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  const_reference pvVar7;
  reference pvVar8;
  ostream *poVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *file_name_1;
  pointer pbVar10;
  pointer pbVar11;
  char *pcVar12;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *this;
  ulong uVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *column_title;
  pointer pbVar14;
  string *psVar15;
  uint uVar16;
  allocator local_409;
  vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
  output_streams;
  string ext_name;
  string error_string;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  dds_files;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ktx_files;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pvr_files;
  string file_name;
  string local_298;
  string local_278;
  string local_258 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  column_titles;
  
  pvr_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pvr_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pvr_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ktx_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ktx_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ktx_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dds_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dds_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dds_files.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (argc == 1) {
    PrintHelp();
  }
  else {
    for (uVar13 = 1; uVar13 < (uint)argc; uVar13 = uVar13 + 1) {
      pcVar12 = argv[uVar13];
      if (*pcVar12 == '-') {
        if (pcVar12[1] == 'h') goto LAB_00128517;
LAB_0012851e:
        iVar5 = strcmp(pcVar12,"--help");
        if (iVar5 == 0) goto LAB_00128531;
      }
      else {
        if ((*pcVar12 != '/') || (pcVar12[1] != '?')) goto LAB_0012851e;
LAB_00128517:
        if (pcVar12[2] != '\0') goto LAB_0012851e;
LAB_00128531:
        PrintHelp();
        pcVar12 = argv[uVar13];
      }
      bVar2 = std::operator==(pcVar12,&(ParameterInfo_abi_cxx11_.
                                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->first);
      if (bVar2) {
        _ZL12s_parameters_0 = '\x01';
      }
      else {
        std::__cxx11::string::string((string *)&file_name,argv[uVar13],(allocator *)&column_titles);
        std::__cxx11::string::string
                  (local_258,file_name._M_dataplus._M_p,(allocator *)&error_string);
        std::__cxx11::string::string((string *)&ext_name,"",(allocator *)&column_titles);
        lVar6 = std::__cxx11::string::rfind((char)local_258,0x2e);
        if (lVar6 != -1) {
          std::__cxx11::string::substr((ulong)&column_titles,(ulong)local_258);
          std::__cxx11::string::operator=((string *)&ext_name,(string *)&column_titles);
          std::__cxx11::string::~string((string *)&column_titles);
        }
        std::__cxx11::string::~string(local_258);
        bVar2 = std::operator==(&ext_name,"pvr");
        this = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&pvr_files;
        if (bVar2) {
LAB_00128632:
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>(this,&file_name);
        }
        else {
          bVar2 = std::operator==(&ext_name,"ktx");
          this = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ktx_files;
          if (bVar2) goto LAB_00128632;
          bVar2 = std::operator==(&ext_name,"dds");
          this = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&dds_files;
          if (bVar2) goto LAB_00128632;
        }
        std::__cxx11::string::~string((string *)&ext_name);
        std::__cxx11::string::~string((string *)&file_name);
      }
    }
    std::
    vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::vector(&output_streams,
             (long)(Defaults::kCsvNames_abi_cxx11_._8_8_ - Defaults::kCsvNames_abi_cxx11_._0_8_) >>
             5,(allocator_type *)&column_titles);
    if (_ZL12s_parameters_0 == '\x01') {
      for (uVar16 = 0; uVar13 = (ulong)uVar16,
          uVar13 < (ulong)((long)output_streams.
                                 super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                           (long)output_streams.
                                 super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start >> 9);
          uVar16 = uVar16 + 1) {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)Defaults::kCsvNames_abi_cxx11_,uVar13);
        pvVar8 = std::
                 vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                 ::at(&output_streams,uVar13);
        std::ofstream::open((string *)pvVar8,(_Ios_Openmode)pvVar7);
        cVar3 = std::__basic_file<char>::is_open();
        if (cVar3 == '\0') {
          printf("ERROR: Unable to open %s",(pvVar7->_M_dataplus)._M_p);
        }
        column_titles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        column_titles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        column_titles.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (3 < uVar16) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/joedavisdev[P]textureinfo/main.cpp"
                        ,0x94,"int main(int, char **)");
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator=(&column_titles,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(&PTR_column_names_abi_cxx11__00140d90)[uVar13]);
        poVar9 = std::operator<<((ostream *)pvVar8,"File name");
        std::operator<<(poVar9,',');
        pbVar10 = column_titles.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar14 = column_titles.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start; pbVar14 != pbVar10;
            pbVar14 = pbVar14 + 1) {
          poVar9 = std::operator<<((ostream *)pvVar8,(string *)pbVar14);
          std::operator<<(poVar9,',');
        }
        std::endl<char,std::char_traits<char>>((ostream *)pvVar8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&column_titles);
      }
    }
    std::__cxx11::string::string((string *)&error_string,"",(allocator *)&column_titles);
    pbVar10 = pvr_files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar14 = pvr_files.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar1 = ktx_files.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish, pbVar14 != pbVar10;
        pbVar14 = pbVar14 + 1) {
      std::ifstream::ifstream((ifstream *)&column_titles,(string *)pbVar14,_S_bin);
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 == '\0') {
        printf("ERROR: Unable to open %s\n",(pbVar14->_M_dataplus)._M_p);
      }
      else {
        file_name._M_dataplus._M_p = (pointer)&PTR_LoadHeader_00140c90;
        file_name.field_2._8_8_ = 0;
        file_name._M_string_length = 0;
        file_name.field_2._M_allocated_capacity = 0;
        ext_name._M_dataplus._M_p = (pointer)&PTR_LoadHeader_00140ce0;
        ext_name.field_2._8_8_ = 0;
        ext_name._M_string_length = 0;
        ext_name.field_2._M_allocated_capacity = 0;
        bVar2 = PvrV3Header::LoadHeader
                          ((PvrV3Header *)&file_name,(ifstream *)&column_titles,&error_string);
        psVar15 = &file_name;
        if (!bVar2) {
          bVar4 = PvrLegacyHeader::LoadHeader
                            ((PvrLegacyHeader *)&ext_name,(ifstream *)&column_titles,&error_string);
          psVar15 = &ext_name;
          if (!bVar4) {
            printf("ERROR: %s - %s\n",(pbVar14->_M_dataplus)._M_p,error_string._M_dataplus._M_p);
            goto LAB_00128963;
          }
        }
        if (_ZL12s_parameters_0 == '\x01') {
          poVar9 = std::operator<<((ostream *)
                                   (output_streams.
                                    super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                                   (ulong)!bVar2 * 0x200),(string *)pbVar14);
          poVar9 = std::operator<<(poVar9,",");
          (**(code **)((psVar15->_M_dataplus)._M_p + 0x10))(&local_298,psVar15);
          poVar9 = std::operator<<(poVar9,(string *)&local_298);
          std::endl<char,std::char_traits<char>>(poVar9);
        }
        else {
          pcVar12 = "PVR (legacy)";
          if (bVar2) {
            pcVar12 = "PVR (v3)";
          }
          std::__cxx11::string::string((string *)&local_298,pcVar12,&local_409);
          (**(code **)((psVar15->_M_dataplus)._M_p + 8))(&local_278,psVar15);
          PrintHeaderInfo(pbVar14,&local_298,&local_278);
          std::__cxx11::string::~string((string *)&local_278);
        }
        std::__cxx11::string::~string((string *)&local_298);
      }
LAB_00128963:
      std::ifstream::~ifstream((ifstream *)&column_titles);
    }
    for (pbVar10 = ktx_files.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar14 = dds_files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish, pbVar10 != pbVar1;
        pbVar10 = pbVar10 + 1) {
      std::ifstream::ifstream((ifstream *)&column_titles,(string *)pbVar10,_S_bin);
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 == '\0') {
        printf("ERROR: Unable to open %s\n",(pbVar10->_M_dataplus)._M_p);
      }
      else {
        file_name._M_dataplus._M_p = (pointer)&PTR_LoadHeader_00140d20;
        file_name.field_2._8_8_ = 0;
        file_name._M_string_length = 0;
        file_name.field_2._M_allocated_capacity = 0;
        bVar2 = KTXHeader::LoadHeader
                          ((KTXHeader *)&file_name,(ifstream *)&column_titles,&error_string);
        if (bVar2) {
          if (_ZL12s_parameters_0 == '\x01') {
            pvVar8 = std::
                     vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                     ::at(&output_streams,2);
            poVar9 = std::operator<<((ostream *)pvVar8,(string *)pbVar10);
            poVar9 = std::operator<<(poVar9,",");
            KTXHeader::ToCsvString_abi_cxx11_(&ext_name,(KTXHeader *)&file_name);
            poVar9 = std::operator<<(poVar9,(string *)&ext_name);
            std::endl<char,std::char_traits<char>>(poVar9);
          }
          else {
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&Defaults::kContainerNames_abi_cxx11_,2);
            KTXHeader::ToString_abi_cxx11_(&ext_name,(KTXHeader *)&file_name);
            PrintHeaderInfo(pbVar10,pvVar7,&ext_name);
          }
          std::__cxx11::string::~string((string *)&ext_name);
        }
        else {
          printf("ERROR: %s - %s\n",(pbVar10->_M_dataplus)._M_p,error_string._M_dataplus._M_p);
        }
      }
      std::ifstream::~ifstream((ifstream *)&column_titles);
    }
    for (pbVar10 = dds_files.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pbVar11 = output_streams.
                  super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start, pbVar10 != pbVar14;
        pbVar10 = pbVar10 + 1) {
      std::ifstream::ifstream((ifstream *)&column_titles,(string *)pbVar10,_S_bin);
      cVar3 = std::__basic_file<char>::is_open();
      if (cVar3 == '\0') {
        printf("ERROR: Unable to open %s\n",(pbVar10->_M_dataplus)._M_p);
      }
      else {
        file_name._M_dataplus._M_p = (pointer)&PTR_LoadHeader_00140d60;
        bVar2 = DDSHeader::LoadHeader
                          ((DDSHeader *)&file_name,(ifstream *)&column_titles,&error_string);
        if (bVar2) {
          if (_ZL12s_parameters_0 == '\x01') {
            pvVar8 = std::
                     vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
                     ::at(&output_streams,3);
            poVar9 = std::operator<<((ostream *)pvVar8,(string *)pbVar10);
            poVar9 = std::operator<<(poVar9,",");
            DDSHeader::ToCsvString_abi_cxx11_(&ext_name,(DDSHeader *)&file_name);
            poVar9 = std::operator<<(poVar9,(string *)&ext_name);
            std::endl<char,std::char_traits<char>>(poVar9);
          }
          else {
            pvVar7 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&Defaults::kContainerNames_abi_cxx11_,3);
            DDSHeader::ToString_abi_cxx11_(&ext_name,(DDSHeader *)&file_name);
            PrintHeaderInfo(pbVar10,pvVar7,&ext_name);
          }
          std::__cxx11::string::~string((string *)&ext_name);
        }
        else {
          printf("ERROR: %s - %s\n",(pbVar10->_M_dataplus)._M_p,error_string._M_dataplus._M_p);
        }
      }
      std::ifstream::~ifstream((ifstream *)&column_titles);
    }
    for (; pbVar11 !=
           output_streams.
           super__Vector_base<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish; pbVar11 = pbVar11 + 0x200) {
      std::ofstream::close();
    }
    std::__cxx11::string::~string((string *)&error_string);
    std::
    vector<std::basic_ofstream<char,_std::char_traits<char>_>,_std::allocator<std::basic_ofstream<char,_std::char_traits<char>_>_>_>
    ::~vector(&output_streams);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&dds_files);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&ktx_files);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&pvr_files);
  return 0;
}

Assistant:

int main (int argc, char *argv[]) {
  std::vector<std::string> pvr_files, ktx_files, dds_files;
  //*-------------------------------
  // Loop through args
  //-------------------------------*/
  if(argc == 1) {
    PrintHelp();
    return 0;
  }
  for(unsigned int index = 1; index < argc; index++) {
    // Flags
    if(strcmp(argv[index], "/?") == 0 ||
    strcmp(argv[index], "-h") == 0 ||
    strcmp(argv[index], "--help") == 0) {
      PrintHelp();
    }
    if(argv[index] == std::get<0>(ParameterInfo[0])) {
      s_parameters.print_csv = true;
      continue;
    }
    // Files
    std::string file_name(argv[index]);
    std::string ext_name(GetFilenameExt(file_name.c_str()));
    if(ext_name == "pvr") {
      pvr_files.push_back(std::move(file_name));
    }
    else if(ext_name == "ktx") {
      ktx_files.push_back(std::move(file_name));
    }
    else if(ext_name == "dds") {
      dds_files.push_back(std::move(file_name));
    }
  }
  //*-------------------------------
  // CSV setup
  //-------------------------------*/
  std::vector<std::ofstream> output_streams(Defaults::kCsvNames.size());
  if(s_parameters.print_csv) {
    for(unsigned int index = 0; index < output_streams.size(); ++index) {
      const std::string& output_name(Defaults::kCsvNames.at(index));
      std::ofstream& output(output_streams.at(index));
      output.open(output_name);
      if(!output.is_open()) {
        printf("ERROR: Unable to open %s", output_name.c_str());
      }
      std::vector<std::string> column_titles;
      switch (index) {
        case Defaults::Types::PVRV3:
          column_titles = PvrV3Info::column_names;
          break;
        case Defaults::Types::PVRLegacy:
          column_titles = PvrLegacyInfo::column_names;
          break;
        case Defaults::Types::KTX:
          column_titles = KTXInfo::column_names;
          break;
          case Defaults::Types::DDS:
          column_titles = DDSInfo::column_names;
          break;
        default:
          assert(0);
          break;
      }
      output << "File name" << ',';
      for(auto& column_title : column_titles)
        output << column_title << ',';
      output << std::endl;
    }
  }
  //*-------------------------------
  // Load files & print
  //-------------------------------*/
  std::string error_string("");
  // PVR files
  for(const auto& file_name: pvr_files) {
    std::ifstream file(file_name, std::ifstream::binary);
    if(!file.is_open()) {
      printf("ERROR: Unable to open %s\n", file_name.c_str());
      continue;
    }
    unsigned int file_type(Defaults::Types::PVRV3);
    IHeader* header(nullptr);
    PvrV3Header pvr_header;
    PvrLegacyHeader pvr_legacy_header;
    // PVR v3
    if(pvr_header.LoadHeader(file, error_string)) header = &pvr_header;
    else file_type = Defaults::Types::PVRLegacy;
    // Legacy container
    if(header == nullptr) {
      if(pvr_legacy_header.LoadHeader(file, error_string)) {
        header = &pvr_legacy_header;
      }
      else {
        printf("ERROR: %s - %s\n",file_name.c_str(), error_string.c_str());
        continue;
      }
    }
    // Print
    if(s_parameters.print_csv)
      output_streams[file_type] << file_name << "," << header->ToCsvString() << std::endl;
    else
      PrintHeaderInfo(
        file_name,
        file_type == Defaults::Types::PVRV3?"PVR (v3)":"PVR (legacy)",
        header->ToString());
  }
  // KTX files
  for(const auto& file_name: ktx_files) {
    std::ifstream file(file_name, std::ifstream::binary);
    if(!file.is_open()) {
      printf("ERROR: Unable to open %s\n", file_name.c_str());
      continue;
    }
    KTXHeader ktx_header;
    if(!ktx_header.LoadHeader(file, error_string)) {
      printf("ERROR: %s - %s\n",file_name.c_str(), error_string.c_str());
        continue;
    }
    // Print
    if(s_parameters.print_csv)
      output_streams.at(Defaults::Types::KTX) << file_name << "," << ktx_header.ToCsvString() << std::endl;
    else
      PrintHeaderInfo(
        file_name,
        Defaults::kContainerNames.at(Defaults::Types::KTX),
        ktx_header.ToString());
  }
  // DDS files
  for(const auto& file_name: dds_files) {
    std::ifstream file(file_name, std::ifstream::binary);
    if(!file.is_open()) {
      printf("ERROR: Unable to open %s\n", file_name.c_str());
      continue;
    }
    DDSHeader header;
    if(!header.LoadHeader(file, error_string)) {
      printf("ERROR: %s - %s\n",file_name.c_str(), error_string.c_str());
        continue;
    }
    // Print
    if(s_parameters.print_csv)
      output_streams.at(Defaults::Types::DDS) << file_name << "," << header.ToCsvString() << std::endl;
    else
      PrintHeaderInfo(
        file_name,
        Defaults::kContainerNames.at(Defaults::Types::DDS),
        header.ToString());
  }
  
  // Shutdown
  for(auto& stream:output_streams)
    stream.close();
}